

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall
crnlib::adaptive_huffman_data_model::adaptive_huffman_data_model
          (adaptive_huffman_data_model *this,adaptive_huffman_data_model *other)

{
  adaptive_huffman_data_model *other_local;
  adaptive_huffman_data_model *this_local;
  
  this->m_total_syms = 0;
  this->m_update_cycle = 0;
  this->m_symbols_until_update = 0;
  this->m_total_count = 0;
  vector<unsigned_short>::vector(&this->m_sym_freq);
  vector<unsigned_short>::vector(&this->m_codes);
  vector<unsigned_char>::vector(&this->m_code_sizes);
  this->m_pDecode_tables = (decoder_tables *)0x0;
  this->m_decoder_table_bits = '\0';
  this->m_encoding = false;
  operator=(this,other);
  return;
}

Assistant:

adaptive_huffman_data_model::adaptive_huffman_data_model(const adaptive_huffman_data_model& other) :
        m_total_syms(0),
        m_update_cycle(0),
        m_symbols_until_update(0),
        m_total_count(0),
        m_pDecode_tables(nullptr),
        m_decoder_table_bits(0),
        m_encoding(false)
    {
        *this = other;
    }